

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQGenerator::SQGenerator(SQGenerator *this,SQSharedState *ss,SQClosure *closure)

{
  SQAllocContext pSVar1;
  
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQGenerator_0019a4a8;
  (this->_closure).super_SQObject._type = 0;
  (this->_closure).super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_closure).super_SQObject.field_0x5 = 0;
  (this->_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_closure).super_SQObject._type = OT_NULL;
  pSVar1 = ss->_alloc_ctx;
  (this->_stack)._vals = (SQObjectPtr *)0x0;
  (this->_stack)._alloc_ctx = pSVar1;
  (this->_stack)._size = 0;
  (this->_stack)._allocated = 0;
  (this->_ci)._closure.super_SQObject._type = 0;
  (this->_ci)._closure.super_SQObject._flags = '\0';
  *(undefined3 *)&(this->_ci)._closure.super_SQObject.field_0x5 = 0;
  (this->_ci)._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_ci)._closure.super_SQObject._type = OT_NULL;
  pSVar1 = ss->_alloc_ctx;
  (this->_etraps)._vals = (SQExceptionTrap *)0x0;
  (this->_etraps)._alloc_ctx = pSVar1;
  (this->_etraps)._size = 0;
  (this->_etraps)._allocated = 0;
  SQObjectPtr::operator=(&this->_closure,closure);
  this->_state = eRunning;
  (this->_ci)._generator = (SQGenerator *)0x0;
  (this->super_SQCollectable)._gc_next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._gc_prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQGenerator(SQSharedState *ss,SQClosure *closure) :
      _stack(ss->_alloc_ctx),
      _etraps(ss->_alloc_ctx)
    {
      _closure=closure;_state=eRunning;_ci._generator=NULL;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);
    }